

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void __thiscall LazyBailOutRecord::Dump(LazyBailOutRecord *this,FunctionBody *functionBody)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  char16 *pcVar7;
  
  iVar4 = (*(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(functionBody);
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  Output::Print(L"Function %s (#%d.%u, #%u) ",CONCAT44(extraout_var,iVar4),(ulong)uVar5,
                (ulong)((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                       .ptr)->functionId,
                (ulong)(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                       m_functionNumber);
  uVar1 = this->bailOutRecord->bailOutOffset;
  pcVar7 = Js::OpCodeUtil::GetOpCodeName(this->bailOutRecord->bailOutOpcode);
  Output::Print(L"Bytecode Offset: #%04x opcode: %s",(ulong)uVar1,pcVar7);
  return;
}

Assistant:

void LazyBailOutRecord::Dump(Js::FunctionBody* functionBody) const
{
    OUTPUT_PRINT(functionBody);
    Output::Print(_u("Bytecode Offset: #%04x opcode: %s"), this->bailOutRecord->GetBailOutOffset(), Js::OpCodeUtil::GetOpCodeName(this->bailOutRecord->GetBailOutOpCode()));
}